

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_certificate_authorities_parse_clienthello
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  __uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> __p;
  tuple<stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter> in_RAX;
  __uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> local_18;
  
  if (contents == (CBS *)0x0) {
    return true;
  }
  if (contents->len != 0) {
    local_18._M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
         (tuple<stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>)
         (tuple<stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>)
         in_RAX.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    SSL_parse_CA_list((bssl *)&local_18,hs->ssl,out_alert,contents);
    __p._M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
         local_18._M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    local_18._M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
         (tuple<stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>)
         (_Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>)0x0;
    std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&hs->ca_names,
               (pointer)__p._M_t.
                        super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl);
    std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&local_18);
    return (hs->ca_names)._M_t.
           super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl !=
           (stack_st_CRYPTO_BUFFER *)0x0;
  }
  return false;
}

Assistant:

static bool ext_certificate_authorities_parse_clienthello(SSL_HANDSHAKE *hs,
                                                          uint8_t *out_alert,
                                                          CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  if (CBS_len(contents) == 0) {
    return false;
  }

  hs->ca_names = SSL_parse_CA_list(hs->ssl, out_alert, contents);
  if (!hs->ca_names) {
    return false;
  }

  return true;
}